

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O2

_func_void_int * putty_signal(int sig,_func_void_int *func)

{
  int iVar1;
  anon_union_8_2_5ad2d23e_for___sigaction_handler aVar2;
  sigaction old;
  sigaction sa;
  
  sa.__sigaction_handler = (anon_union_8_2_5ad2d23e_for___sigaction_handler)func;
  iVar1 = sigemptyset((sigset_t *)&sa.sa_mask);
  aVar2 = (anon_union_8_2_5ad2d23e_for___sigaction_handler)0xffffffffffffffff;
  if (-1 < iVar1) {
    sa.sa_flags = 0x10000000;
    iVar1 = sigaction(sig,(sigaction *)&sa,(sigaction *)&old);
    if (-1 < iVar1) {
      aVar2 = old.__sigaction_handler;
    }
  }
  return aVar2.sa_handler;
}

Assistant:

void (*putty_signal(int sig, void (*func)(int)))(int)
{
    struct sigaction sa;
    struct sigaction old;

    sa.sa_handler = func;
    if(sigemptyset(&sa.sa_mask) < 0)
        return SIG_ERR;
    sa.sa_flags = SA_RESTART;
    if(sigaction(sig, &sa, &old) < 0)
        return SIG_ERR;
    return old.sa_handler;
}